

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O2

shared_ptr<HDD> __thiscall
HDD::CreateDisk(HDD *this,string *path,int64_t llTotalBytes_,IDENTIFYDEVICE *pIdentify_,
               bool fOverwrite_)

{
  _func_int **pp_Var1;
  bool bVar2;
  char cVar3;
  HDFHDD *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<HDD> sVar5;
  __shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->_vptr_HDD = (_func_int **)0x0;
  this->h = 0;
  this->cyls = 0;
  bVar2 = IsHddImage(path);
  _Var4._M_pi = extraout_RDX;
  if (bVar2) {
    this_00 = (HDFHDD *)operator_new(0x298);
    memset(this_00,0,0x298);
    HDFHDD::HDFHDD(this_00);
    std::__shared_ptr<HDD,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HDFHDD,void>
              ((__shared_ptr<HDD,(__gnu_cxx::_Lock_policy)2> *)&local_40,this_00);
    std::__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    pp_Var1 = this->_vptr_HDD;
    _Var4._M_pi = extraout_RDX_00;
    if (pp_Var1 != (_func_int **)0x0) {
      cVar3 = (**(code **)(*pp_Var1 + 0x40))(pp_Var1,path,llTotalBytes_,pIdentify_,fOverwrite_);
      _Var4._M_pi = extraout_RDX_01;
      if (cVar3 == '\0') {
        std::__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2> *)this);
        _Var4._M_pi = extraout_RDX_02;
      }
    }
  }
  sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<HDD>)sVar5.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HDD> HDD::CreateDisk(const std::string& path, int64_t llTotalBytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_)
{
    std::shared_ptr<HDD> hdd;

    if (IsHddImage(path))
        hdd = std::shared_ptr<HDD>(new HDFHDD());

    if (hdd && !hdd->Create(path, llTotalBytes_, pIdentify_, fOverwrite_))
        hdd.reset();

    return hdd;
}